

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::ClearCurrentSection(FConfigFile *this)

{
  FConfigEntry *pFVar1;
  FConfigEntry *next;
  FConfigEntry *entry;
  FConfigFile *this_local;
  
  if (this->CurrentSection != (FConfigSection *)0x0) {
    pFVar1 = this->CurrentSection->RootEntry;
    while (next = pFVar1, next != (FConfigEntry *)0x0) {
      pFVar1 = next->Next;
      if (next->Value != (char *)0x0) {
        operator_delete__(next->Value);
      }
      if (next != (FConfigEntry *)0x0) {
        operator_delete__(next);
      }
    }
    this->CurrentSection->RootEntry = (FConfigEntry *)0x0;
    this->CurrentSection->LastEntryPtr = &this->CurrentSection->RootEntry;
  }
  return;
}

Assistant:

void FConfigFile::ClearCurrentSection ()
{
	if (CurrentSection != NULL)
	{
		FConfigEntry *entry, *next;

		entry = CurrentSection->RootEntry;
		while (entry != NULL)
		{
			next = entry->Next;
			delete[] entry->Value;
			delete[] (char *)entry;
			entry = next;
		}
		CurrentSection->RootEntry = NULL;
		CurrentSection->LastEntryPtr = &CurrentSection->RootEntry;
	}
}